

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6)

{
  pointer pEVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5_00;
  string *value;
  undefined8 in_stack_fffffffffffffe88;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffeb0;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffed0;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffee0;
  undefined1 local_108 [32];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  ExceptionFormatValue local_68;
  
  pEVar1 = (values->
           super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_88[0] = local_78;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pEVar1,
             &((values->
               super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               )._M_impl.super__Vector_impl_data._M_finish)->type + (long)pEVar1);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            (&local_68,(ExceptionFormatValue *)local_88,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.str_val._M_dataplus._M_p != &local_68.str_val.field_2) {
    operator_delete(local_68.str_val._M_dataplus._M_p);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  local_108._0_8_ = local_108 + 0x10;
  pcVar2 = (param->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_108,pcVar2,pcVar2 + param->_M_string_length);
  _Var5._M_p = &stack0xfffffffffffffee8;
  pcVar2 = (params->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffed8,pcVar2,pcVar2 + params->_M_string_length);
  _Var4._M_p = &stack0xfffffffffffffec8;
  pcVar2 = (params_1->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffeb8,pcVar2,pcVar2 + params_1->_M_string_length);
  _Var3._M_p = &stack0xfffffffffffffea8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffe98,*(long *)params_2._M_dataplus._M_p,
             *(long *)(params_2._M_dataplus._M_p + 8) + *(long *)params_2._M_dataplus._M_p);
  local_c8[0] = local_b8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,*(long *)params_2._M_string_length,
             *(long *)(params_2._M_string_length + 8) + *(long *)params_2._M_string_length);
  local_e8[0] = local_d8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,*(long *)params_2.field_2._M_allocated_capacity,
             *(long *)(params_2.field_2._M_allocated_capacity + 8) +
             *(long *)params_2.field_2._M_allocated_capacity);
  local_a8[0] = local_98;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,*(long *)params_2.field_2._8_8_,
             *(long *)(params_2.field_2._8_8_ + 8) + *(long *)params_2.field_2._8_8_);
  params_2_00._M_string_length = (size_type)local_e8;
  params_2_00._M_dataplus._M_p = (pointer)local_c8;
  params_2_00.field_2._M_allocated_capacity = (size_type)local_a8;
  params_2_00.field_2._8_8_ = in_stack_fffffffffffffe88;
  params_3_00._M_string_length = (size_type)_Var3._M_p;
  params_3_00._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  params_3_00.field_2 = in_stack_fffffffffffffea0;
  params_4_00._M_string_length = (size_type)_Var4._M_p;
  params_4_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb0;
  params_4_00.field_2 = in_stack_fffffffffffffec0;
  params_5_00._M_string_length = (size_type)_Var5._M_p;
  params_5_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffed0;
  params_5_00.field_2 = in_stack_fffffffffffffee0;
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             local_108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffed8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffeb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffe98,params_2_00,params_3_00,params_4_00,params_5_00);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0]);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  if (_Var3._M_p != &stack0xfffffffffffffea8) {
    operator_delete(_Var3._M_p);
  }
  if (_Var4._M_p != &stack0xfffffffffffffec8) {
    operator_delete(_Var4._M_p);
  }
  if (_Var5._M_p != &stack0xfffffffffffffee8) {
    operator_delete(_Var5._M_p);
  }
  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}